

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O2

bool hashSearch2<unsigned_short>
               (vector<unsigned_short,_std::allocator<unsigned_short>_> *keys,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *vals,string *hash_str,string *map_name,string *default_value,uint8_t expansion,
               uint8_t reduction,bool nonKeyLookups)

{
  pointer puVar1;
  long lVar2;
  string map_name_00;
  pointer pBVar3;
  pointer pBVar4;
  Bin<unsigned_short> *pBVar5;
  bool bVar6;
  ushort uVar7;
  uint uVar8;
  size_t n1;
  size_t n2;
  undefined4 *puVar9;
  ulong uVar10;
  size_type sVar11;
  Bin<unsigned_short> *bin;
  ulong uVar12;
  __normal_iterator<Bin<unsigned_short>_*,_std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>_>
  __i;
  long lVar13;
  pointer pBVar14;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range1;
  unsigned_short *key;
  pointer __x;
  undefined8 in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef6;
  vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> layer1;
  string local_b0 [32];
  vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_> local_90;
  vector<bool,_std::allocator<bool>_> final_layer;
  string local_50 [32];
  
  uVar12 = (long)(keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_finish -
           (long)(keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl
                 .super__Vector_impl_data._M_start >> 1;
  if (uVar12 < 2) {
    __assert_fail("keys.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdc,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  bVar6 = hasDuplicates<unsigned_short>(keys);
  if (bVar6) {
    __assert_fail("!hasDuplicates(keys)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xdd,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  if ((long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_finish -
      (long)(vals->
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start >> 5 != uVar12) {
    __assert_fail("vals.size() == keys.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JohnDTill[P]Poifect/hashsearch2.h"
                  ,0xde,
                  "bool hashSearch2(const std::vector<KeyType> &, const std::vector<std::string> &, std::string &, std::string, std::string, uint8_t, uint8_t, bool) [KeyType = unsigned short]"
                 );
  }
  n1 = getModulusBitmask((uVar12 * expansion) / (ulong)reduction);
  n2 = getModulusBitmask((long)(keys->
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                               _M_impl.super__Vector_impl_data._M_finish -
                         (long)(keys->
                               super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>).
                               _M_impl.super__Vector_impl_data._M_start >> 1);
  uVar12 = 0;
  do {
    if (uVar12 == 0x20) {
LAB_001086e2:
      return uVar12 < 0x20;
    }
    uVar7 = (ushort)(byte)(&DAT_0010fa60)[uVar12];
    std::__cxx11::string::string(local_b0,(string *)map_name);
    std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::vector
              (&layer1,n1 + 1,(allocator_type *)&final_layer);
    puVar9 = (undefined4 *)
             CONCAT71(layer1.
                      super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._1_7_,
                      layer1.
                      super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                      ._M_impl.super__Vector_impl_data._M_start._0_1_);
    for (sVar11 = 0; n1 + 1 != sVar11; sVar11 = sVar11 + 1) {
      *puVar9 = (int)sVar11;
      puVar9 = puVar9 + 8;
    }
    puVar1 = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    for (__x = (keys->super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>)._M_impl.
               super__Vector_impl_data._M_start;
        pBVar4 = layer1.
                 super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish, __x != puVar1; __x = __x + 1) {
      uVar8 = (uint)uVar7 * (uint)(ushort)(*__x >> 7 ^ *__x);
      std::vector<unsigned_short,_std::allocator<unsigned_short>_>::push_back
                ((vector<unsigned_short,_std::allocator<unsigned_short>_> *)
                 (CONCAT71(layer1.
                           super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._1_7_,
                           layer1.
                           super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_1_) +
                  (ulong)((uint)n1 & (uVar8 >> 7 ^ uVar8)) * 0x20 + 8),__x);
    }
    pBVar3 = (pointer)CONCAT71(layer1.
                               super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               layer1.
                               super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pBVar3 != layer1.
                  super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>.
                  _M_impl.super__Vector_impl_data._M_finish) {
      lVar13 = (long)layer1.
                     super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>.
                     _M_impl.super__Vector_impl_data._M_finish - (long)pBVar3;
      uVar10 = lVar13 >> 5;
      lVar2 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                (pBVar3,layer1.
                        super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
      if (lVar13 < 0x201) {
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                  (pBVar3,pBVar4);
      }
      else {
        pBVar14 = pBVar3 + 0x10;
        std::
        __insertion_sort<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,__gnu_cxx::__ops::_Iter_comp_iter<testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                  (pBVar3,pBVar14);
        for (; pBVar14 != pBVar4; pBVar14 = pBVar14 + 1) {
          std::
          __unguarded_linear_insert<__gnu_cxx::__normal_iterator<Bin<unsigned_short>*,std::vector<Bin<unsigned_short>,std::allocator<Bin<unsigned_short>>>>,__gnu_cxx::__ops::_Val_comp_iter<testSeed<unsigned_short>(std::vector<unsigned_short,std::allocator<unsigned_short>>const&,unsigned_short_const&,unsigned_long,unsigned_long,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&,std::__cxx11::string&,std::__cxx11::string,std::__cxx11::string_const&,bool)::LayerSort>>
                    (pBVar14);
        }
      }
    }
    uVar10 = *(long *)(CONCAT71(layer1.
                                super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                layer1.
                                super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_) + 0x10) -
             *(long *)(CONCAT71(layer1.
                                super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                layer1.
                                super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_) + 8);
    if (uVar10 == 2) {
      std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::~vector(&layer1);
      std::__cxx11::string::~string(local_b0);
      goto LAB_001086e2;
    }
    if (uVar10 < 0x13) {
      in_stack_fffffffffffffef0 = in_stack_fffffffffffffef0 & 0xffffff;
      std::vector<bool,_std::allocator<bool>_>::vector
                (&final_layer,n2 + 1,(bool *)&stack0xfffffffffffffef3,
                 (allocator_type *)&stack0xfffffffffffffef7);
      pBVar4 = layer1.super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      pBVar5 = (Bin<unsigned_short> *)
               CONCAT71(layer1.
                        super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._1_7_,
                        layer1.
                        super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                        ._M_impl.super__Vector_impl_data._M_start._0_1_);
      do {
        bin = pBVar5;
        if (bin == pBVar4) {
          std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::vector
                    (&local_90,&layer1);
          std::__cxx11::string::string(local_50,local_b0);
          map_name_00._M_string_length = (size_type)default_value;
          map_name_00._M_dataplus._M_p = (pointer)local_50;
          map_name_00.field_2._M_local_buf[0] = nonKeyLookups;
          map_name_00.field_2._M_allocated_capacity._1_7_ = 0;
          map_name_00.field_2._8_8_ = in_stack_fffffffffffffee8;
          writeHash2<unsigned_short>
                    (keys,(SeedType *)&stack0xfffffffffffffef4,n1,n2,vals,&local_90,hash_str,
                     map_name_00,
                     (string *)
                     CONCAT26(in_stack_fffffffffffffef6,CONCAT24(uVar7,in_stack_fffffffffffffef0)),
                     (bool)layer1.
                           super__Vector_base<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>
                           ._M_impl.super__Vector_impl_data._M_start._0_1_);
          std::__cxx11::string::~string(local_50);
          std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::~vector
                    (&local_90);
          break;
        }
        bVar6 = findSeed<unsigned_short>(bin,n2,&final_layer);
        pBVar5 = bin + 1;
      } while (bVar6);
      std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
                (&final_layer.super__Bvector_base<std::allocator<bool>_>);
      std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::~vector(&layer1);
      std::__cxx11::string::~string(local_b0);
      if (bin == pBVar4) goto LAB_001086e2;
    }
    else {
      std::vector<Bin<unsigned_short>,_std::allocator<Bin<unsigned_short>_>_>::~vector(&layer1);
      std::__cxx11::string::~string(local_b0);
    }
    uVar12 = uVar12 + 1;
  } while( true );
}

Assistant:

bool hashSearch2(const std::vector<KeyType>& keys,
                 const std::vector<std::string>& vals,
                 std::string& hash_str,
                 std::string map_name = "PoifectMap",
                 std::string default_value = "",
                 uint8_t expansion = 1,
                 uint8_t reduction = 1,
                 bool nonKeyLookups = true){
    assert(keys.size() > 1);
    assert(!hasDuplicates(keys));
    assert(vals.size() == keys.size());

    const size_t n1 = getModulusBitmask(keys.size()*expansion/reduction);
    const size_t n2 = getModulusBitmask(keys.size());

    const uint8_t primes[32] = {  0,   1,   2,   3,   5,
                                  7,  11,  13,  17,  19,
                                 23,  29,  31,  37,  41,
                                 43,  47,  53,  59,  61,
                                 67,  71,  73,  79,  83,
                                 89,  97, 101, 103, 107,
                                109, 113};

    for(SeedType seed = 0; seed < 32; seed++)
        if(testSeed<KeyType>(keys, primes[seed], n1, n2, vals, hash_str, map_name, default_value, nonKeyLookups))
            return true;

    return false;
}